

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

ON_PolylineCurve * __thiscall
ON_PolylineCurve::operator=(ON_PolylineCurve *this,ON_3dPointArray *src)

{
  uint uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  ON_Polyline::operator=(&this->m_pline,src);
  this->m_dim = 3;
  uVar1 = (src->super_ON_SimpleArray<ON_3dPoint>).m_count;
  uVar4 = (this->m_t).m_capacity;
  if (uVar4 < uVar1) {
    ON_SimpleArray<double>::SetCapacity(&this->m_t,(long)(int)uVar1);
    uVar4 = (this->m_t).m_capacity;
  }
  if ((-1 < (int)uVar1) && ((int)uVar1 <= (int)uVar4)) {
    (this->m_t).m_count = uVar1;
  }
  auVar3 = _DAT_0069b120;
  if (0 < (int)uVar1) {
    pdVar2 = (this->m_t).m_a;
    lVar6 = (ulong)uVar1 - 1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0069b120;
    auVar8 = _DAT_0069b170;
    do {
      auVar9 = auVar8 ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        pdVar2[uVar5] = (double)(int)uVar5;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        pdVar2[uVar5 + 1] = (double)((int)uVar5 + 1);
      }
      uVar5 = uVar5 + 2;
      lVar6 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar6 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar5);
  }
  return this;
}

Assistant:

ON_PolylineCurve& ON_PolylineCurve::operator=( const ON_3dPointArray& src )
{
  m_pline = src;
  m_dim   = 3;
  const int count = src.Count();
  m_t.Reserve(count);
  m_t.SetCount(count);
  int i;
  for (i = 0; i < count; i++) {
    m_t[i] = (double)i;
  }
  return *this;
}